

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

Term * Inferences::getPlaceholderForTerm
                 (vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *ts,uint i)

{
  Symbol *this;
  Signature *this_00;
  uint symbolNumber;
  int iVar1;
  Term **ppTVar2;
  OperatorType *type;
  Term *val;
  uint i_00;
  pair<Kernel::TermList,_unsigned_int> key;
  pair<Kernel::TermList,_unsigned_int> key_00;
  TermList srt;
  TermList local_b8;
  uint64_t local_b0;
  uint local_a8;
  undefined1 local_a0 [32];
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (getPlaceholderForTerm(std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>const&,unsigned_int)
      ::placeholders == '\0') {
    iVar1 = __cxa_guard_acquire(&getPlaceholderForTerm(std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>const&,unsigned_int)
                                 ::placeholders);
    if (iVar1 != 0) {
      getPlaceholderForTerm::placeholders._timestamp = 1;
      getPlaceholderForTerm::placeholders._size = 0;
      getPlaceholderForTerm::placeholders._deleted = 0;
      getPlaceholderForTerm::placeholders._capacityIndex = 0;
      getPlaceholderForTerm::placeholders._capacity = 0;
      getPlaceholderForTerm::placeholders._20_8_ = 0;
      getPlaceholderForTerm::placeholders._28_8_ = 0;
      getPlaceholderForTerm::placeholders._afterLast._4_4_ = 0;
      __cxa_atexit(Lib::
                   DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                   ::~DHMap,&getPlaceholderForTerm::placeholders,&__dso_handle);
      __cxa_guard_release(&getPlaceholderForTerm(std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>const&,unsigned_int)
                           ::placeholders);
    }
  }
  local_b8 = Kernel::SortHelper::getResultSort
                       ((ts->super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[(long)(ulong)i]);
  local_b0 = local_b8._content;
  local_a8 = i;
  Lib::
  DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find((DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          *)local_a0,(pair<Kernel::TermList,_unsigned_int> *)&getPlaceholderForTerm::placeholders);
  this_00 = DAT_00a14190;
  if ((char *)local_a0._0_8_ == (char *)0x0) {
    Kernel::TermList::toString_abi_cxx11_(&local_40,&local_b8,false);
    std::operator+(&local_60,&local_40,"_placeholder");
    Lib::Int::toString_abi_cxx11_((string *)(local_a0 + 0x20),(Int *)(ulong)i,i_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a0 + 0x20));
    symbolNumber = Kernel::Signature::addFreshFunction(this_00,0,(char *)local_a0._0_8_,(char *)0x0)
    ;
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    this = (DAT_00a14190->_funs)._stack[symbolNumber];
    type = Kernel::OperatorType::getConstantsType(local_b8,0);
    Kernel::Signature::Symbol::setType(this,type);
    val = Kernel::Term::createConstant(symbolNumber);
    key_00.second = local_a8;
    key_00.first._content = local_b0;
    key_00._12_4_ = 0;
    Lib::
    DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::insert(&getPlaceholderForTerm::placeholders,key_00,val);
  }
  else {
    key.second = local_a8;
    key.first._content = local_b0;
    key._12_4_ = 0;
    ppTVar2 = Lib::
              DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::get(&getPlaceholderForTerm::placeholders,key);
    val = *ppTVar2;
  }
  return val;
}

Assistant:

Term* getPlaceholderForTerm(const std::vector<Term*>& ts, unsigned i)
{
  static DHMap<pair<TermList,unsigned>,Term*> placeholders;
  TermList srt = SortHelper::getResultSort(ts[i]);
  auto p = make_pair(srt,i);
  if(!placeholders.find(p)){
    unsigned fresh = env.signature->addFreshFunction(0,(srt.toString() + "_placeholder" + Int::toString(i)).c_str());
    env.signature->getFunction(fresh)->setType(OperatorType::getConstantsType(srt));
    auto res = Term::createConstant(fresh);
    placeholders.insert(p,res);
    return res;
  }
  return placeholders.get(p);
}